

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O0

int fits_pixel_filter(PixelFilter *filter,int *status)

{
  fitsfile *fptr;
  fitsfile *fptr_00;
  int iVar1;
  int iVar2;
  char *pcVar3;
  iteratorCol *colIter_00;
  char *comm;
  long lVar4;
  char *parInfo;
  char *parName;
  DataInfo *varInfo;
  iteratorCol *colIter;
  long lStack_390;
  int tstatus;
  long nullVal;
  char card [81];
  int local_32c;
  int keyclass;
  int more;
  int ncards;
  int i;
  char *type;
  ParseData lParse;
  char local_228 [4];
  int writeBlankKwd;
  char msg [256];
  char *DEFAULT_TAGS [1];
  fitsfile *outfptr;
  fitsfile *infptr;
  int datatype;
  Node *result;
  int col_cnt;
  long naxes [5];
  long local_c8;
  long nelem;
  int bitpix;
  int naxis;
  parseInfo Info;
  int *status_local;
  PixelFilter *filter_local;
  
  Info.parseVariables.zeros[3] = (long)status;
  memset(&bitpix,0,0x90);
  msg._248_8_ = (long)"Character %d in this keyword is illegal. Hex Value = %X" + 0x36;
  lParse._228_4_ = 0;
  pcVar3 = getenv("DEBUG_PIXFILTER");
  DEBUG_PIXFILTER = (int)(pcVar3 != (char *)0x0);
  memset(&bitpix,0,0x90);
  if (*(int *)Info.parseVariables.zeros[3] != 0) {
    return *(int *)Info.parseVariables.zeros[3];
  }
  if ((((filter->tag == (char **)0x0) || (*filter->tag == (char *)0x0)) || (**filter->tag == '\0'))
     && (filter->tag = (char **)(msg + 0xf8), DEBUG_PIXFILTER != 0)) {
    printf("using default tag \'%s\'\n");
  }
  fptr = *filter->ifptr;
  fptr_00 = filter->ofptr;
  lParse.varData = (DataInfo *)filter;
  iVar1 = ffiprs(fptr,0,filter->expression,5,&bitpix,&local_c8,(int *)((long)&nelem + 4),
                 (long *)&stack0xffffffffffffff08,(ParseData *)&type,
                 (int *)Info.parseVariables.zeros[3]);
  if (iVar1 != 0) goto LAB_00159dbb;
  if (local_c8 < 0) {
    local_c8 = -local_c8;
  }
  if (bitpix == 1) {
LAB_0015955a:
    _ncards = "BIT";
    if (DEBUG_PIXFILTER != 0) {
      printf("hmm, image from bits?\n");
    }
  }
  else if (bitpix == 0xe) {
    _ncards = "LOGICAL";
  }
  else {
    if (bitpix == 0x10) {
      _ncards = "STRING";
      *(undefined4 *)Info.parseVariables.zeros[3] = 0xffffffff;
      ffpmsg("pixel_filter: cannot have string image");
      goto LAB_0015955a;
    }
    if (bitpix == 0x29) {
      _ncards = "LONG";
    }
    else if (bitpix == 0x52) {
      _ncards = "DOUBLE";
    }
    else {
      _ncards = "UNKNOWN?!";
      *(undefined4 *)Info.parseVariables.zeros[3] = 0xffffffff;
      ffpmsg("pixel_filter: unexpected result datatype");
    }
  }
  if (DEBUG_PIXFILTER != 0) {
    printf("result type is %s [%d]\n",_ncards,(ulong)(uint)bitpix);
  }
  if (*(int *)Info.parseVariables.zeros[3] == 0) {
    iVar1 = ffgipr(fptr,5,(int *)&nelem,(int *)((long)&nelem + 4),(long *)&stack0xffffffffffffff08,
                   (int *)Info.parseVariables.zeros[3]);
    if (iVar1 == 0) {
      if (DEBUG_PIXFILTER != 0) {
        printf("input bitpix %d\n",(ulong)(uint)nelem);
      }
      if ((bitpix == 0x52) && ((uint)nelem != 0xffffffc0)) {
        nelem._0_4_ = 0xffffffe0;
      }
      if (filter->bitpix != 0) {
        nelem._0_4_ = filter->bitpix;
      }
      if (DEBUG_PIXFILTER != 0) {
        printf("output bitpix %d\n",(ulong)(uint)nelem);
      }
      iVar1 = ffcrim(fptr_00,(uint)nelem,nelem._4_4_,(long *)&stack0xffffffffffffff08,
                     (int *)Info.parseVariables.zeros[3]);
      if (iVar1 == 0) {
        iVar1 = ffghsp(fptr,&keyclass,&local_32c,(int *)Info.parseVariables.zeros[3]);
        if (iVar1 == 0) {
          for (more = 1; more <= keyclass; more = more + 1) {
            iVar1 = ffgrec(fptr,more,(char *)&nullVal,(int *)Info.parseVariables.zeros[3]);
            if (iVar1 != 0) {
              snprintf(local_228,0x100,"pixel_filter: unable to read keycard %d",(ulong)(uint)more);
              ffpmsg(local_228);
              goto LAB_00159dbb;
            }
            register0x00000000 = ffgkcl((char *)&nullVal);
            if ((((register0x00000000 != 10) && ((register0x00000000 != 0x82 || (0xb < more)))) &&
                ((register0x00000000 != 0x28 || (-1 < (int)(uint)nelem)))) &&
               (((register0x00000000 != 0x1e || (-1 < (int)(uint)nelem)) &&
                (iVar1 = ffprec(fptr_00,(char *)&nullVal,(int *)Info.parseVariables.zeros[3]),
                iVar1 != 0)))) {
              snprintf(local_228,0x100,"pixel_filter: unable to write keycard \'%s\' [%d]\n",
                       &nullVal,(ulong)*(uint *)Info.parseVariables.zeros[3]);
              ffpmsg(local_228);
              goto LAB_00159dbb;
            }
          }
          if ((uint)nelem == 0xffffffc0) {
            bitpix = 0x52;
          }
          else if ((uint)nelem == 0xffffffe0) {
            bitpix = 0x2a;
          }
          else if ((uint)nelem == 8) {
            bitpix = 0xb;
          }
          else if ((uint)nelem == 0x10) {
            bitpix = 0x15;
          }
          else {
            if ((uint)nelem != 0x20) {
              snprintf(local_228,0x100,"pixel_filter: unexpected output bitpix %d\n",
                       (ulong)(uint)nelem);
              ffpmsg(local_228);
              *(undefined4 *)Info.parseVariables.zeros[3] = 0xffffffff;
              goto LAB_00159dbb;
            }
            bitpix = 0x29;
          }
          if (0 < (int)(uint)nelem) {
            lStack_390 = filter->blank;
            if (filter->blank == 0) {
              colIter._4_4_ = 0;
              iVar1 = ffgkyj(fptr,"BLANK",&stack0xfffffffffffffc70,(char *)0x0,
                             (int *)((long)&colIter + 4));
              if (iVar1 != 0) {
                lParse._228_4_ = 1;
                if ((uint)nelem == 8) {
                  lStack_390 = 0xff;
                }
                else if ((uint)nelem == 0x10) {
                  lStack_390 = -0x8000;
                }
                else if ((uint)nelem == 0x20) {
                  lStack_390 = -0x80000000;
                }
                else {
                  printf("unhandled positive output BITPIX %d\n",(ulong)(uint)nelem);
                }
              }
              filter->blank = lStack_390;
            }
            ffpnul(fptr_00,filter->blank,(int *)Info.parseVariables.zeros[3]);
            if (DEBUG_PIXFILTER != 0) {
              printf("using blank %ld\n",lStack_390);
            }
          }
          iVar1 = (int)lParse.nRows;
          if (filter->keyword[0] == '\0') {
            iVar2 = fits_parser_allocateCol
                              ((ParseData *)&type,(int)lParse.nRows,
                               (int *)Info.parseVariables.zeros[3]);
            if (iVar2 == 0) {
              lParse.nRows._0_4_ = (int)lParse.nRows + 1;
              colIter_00 = (iteratorCol *)(lParse.nAxes[4] + (long)iVar1 * 0x110);
              colIter_00->fptr = filter->ofptr;
              colIter_00->iotype = 2;
              set_image_col_types((ParseData *)&type,colIter_00->fptr,"CREATED",(uint)nelem,
                                  (DataInfo *)
                                  ((lParse.colData)->colname + (long)iVar1 * 0xa0 + -0xc),colIter_00
                                 );
              Info.nullPtr = (void *)0xffffffffffffffff;
              Info._32_8_ = &type;
              iVar1 = ffiter((int)lParse.nRows,(iteratorCol *)lParse.nAxes[4],0,0,fits_parser_workfn
                             ,&bitpix,(int *)Info.parseVariables.zeros[3]);
              if (iVar1 == -1) {
                *(undefined4 *)Info.parseVariables.zeros[3] = 0;
              }
              else if (*(int *)Info.parseVariables.zeros[3] != 0) goto LAB_00159dbb;
              if ((int)Info.maxRows == 0) {
                if ((0 < (int)(uint)nelem) &&
                   (iVar1 = ffpnul(fptr_00,-0x4995cdd1,(int *)Info.parseVariables.zeros[3]),
                   iVar1 != 0)) {
                  ffpmsg("pixel_filter: unable to reset imgnull");
                }
              }
              else if (lParse._228_4_ != 0) {
                ffukyj(fptr_00,"BLANK",filter->blank,"NULL pixel value",
                       (int *)Info.parseVariables.zeros[3]);
                if (*(int *)Info.parseVariables.zeros[3] != 0) {
                  ffpmsg("pixel_filter: unable to write BLANK keyword");
                }
                if (DEBUG_PIXFILTER != 0) {
                  printf("output has NULLs\n");
                  printf("wrote blank [%d]\n",(ulong)*(uint *)Info.parseVariables.zeros[3]);
                }
              }
            }
          }
          else {
            pcVar3 = filter->keyword;
            comm = filter->comment;
            lVar4 = lParse._48_8_ + (long)lParse.nNodes * 0x180;
            if (bitpix != 1) {
              if (bitpix == 0xe) {
                ffukyl(fptr_00,pcVar3,(int)*(char *)(lVar4 + 0x80),comm,
                       (int *)Info.parseVariables.zeros[3]);
                goto LAB_00159dbb;
              }
              if (bitpix != 0x10) {
                if (bitpix == 0x29) {
                  ffukyj(fptr_00,pcVar3,*(LONGLONG *)(lVar4 + 0x80),comm,
                         (int *)Info.parseVariables.zeros[3]);
                }
                else if (bitpix == 0x52) {
                  ffukyd(fptr_00,pcVar3,*(double *)(lVar4 + 0x80),0xf,comm,
                         (int *)Info.parseVariables.zeros[3]);
                }
                else {
                  snprintf(local_228,0x100,"pixel_filter: unexpected constant result type [%d]\n",
                           (ulong)(uint)bitpix);
                  ffpmsg(local_228);
                }
                goto LAB_00159dbb;
              }
            }
            ffukys(fptr_00,pcVar3,(char *)(lVar4 + 0x80),comm,(int *)Info.parseVariables.zeros[3]);
          }
        }
        else {
          ffpmsg("pixel_filter: unable to determine number of keycards");
        }
      }
      else {
        ffpmsg("pixel_filter: unable to create output image");
      }
    }
    else {
      ffpmsg("pixel_filter: unable to read input image parameters");
    }
  }
LAB_00159dbb:
  ffcprs((ParseData *)&type);
  return *(int *)Info.parseVariables.zeros[3];
}

Assistant:

int fits_pixel_filter (PixelFilter * filter, int * status)
/* Evaluate an expression using the data in the input FITS file(s)          */
/*--------------------------------------------------------------------------*/
{
   parseInfo Info = { 0 };
   int naxis, bitpix;
   long nelem, naxes[MAXDIMS];
   int col_cnt;
   Node *result;
   int datatype;
   fitsfile * infptr;
   fitsfile * outfptr;
   char * DEFAULT_TAGS[] = { "X" };
   char msg[256];
   int writeBlankKwd = 0;   /* write BLANK if any output nulls? */
   ParseData lParse;

   DEBUG_PIXFILTER = getenv("DEBUG_PIXFILTER") ? 1 : 0;

   memset(&Info, 0, sizeof(Info));   

   if (*status)
      return (*status);

   if (!filter->tag || !filter->tag[0] || !filter->tag[0][0]) {
      filter->tag = DEFAULT_TAGS;
      if (DEBUG_PIXFILTER)
         printf("using default tag '%s'\n", filter->tag[0]);
   }

   infptr = filter->ifptr[0];
   outfptr = filter->ofptr;
   lParse.pixFilter = filter;

   if (ffiprs(infptr, 0, filter->expression, MAXDIMS,
	      &Info.datatype, &nelem, &naxis, naxes, &lParse, status)) {
      goto CLEANUP;
   }


   if (nelem < 0) {
      nelem = -nelem;
   }

   {
      /* validate result type */
      const char * type = 0;
      switch (Info.datatype) {
         case TLOGICAL:  type = "LOGICAL"; break;
         case TLONG:     type = "LONG"; break;
         case TDOUBLE:   type = "DOUBLE"; break;
         case TSTRING:   type = "STRING";
                         *status = pERROR;
                         ffpmsg("pixel_filter: cannot have string image");
         case TBIT:      type = "BIT";
                         if (DEBUG_PIXFILTER)
                            printf("hmm, image from bits?\n");
                         break;
         default:       type = "UNKNOWN?!";
                        *status = pERROR;
                        ffpmsg("pixel_filter: unexpected result datatype");
      }
      if (DEBUG_PIXFILTER)
         printf("result type is %s [%d]\n", type, Info.datatype);
      if (*status)
         goto CLEANUP;
   }

   if (fits_get_img_param(infptr, MAXDIMS,
            &bitpix, &naxis, &naxes[0], status)) {
      ffpmsg("pixel_filter: unable to read input image parameters");
      goto CLEANUP;
   }

   if (DEBUG_PIXFILTER)
      printf("input bitpix %d\n", bitpix);

   if (Info.datatype == TDOUBLE) {
       /*  for floating point expressions, set the default output image to
           bitpix = -32 (float) unless the default is already a double */
       if (bitpix != DOUBLE_IMG)
           bitpix = FLOAT_IMG;
   }

   /* override output image bitpix if specified by caller */
   if (filter->bitpix)
      bitpix = filter->bitpix;
   if (DEBUG_PIXFILTER)
      printf("output bitpix %d\n", bitpix);

   if (fits_create_img(outfptr, bitpix, naxis, naxes, status)) {
      ffpmsg("pixel_filter: unable to create output image");
      goto CLEANUP;
   }

   /* transfer keycards */
   {
      int i, ncards, more;
      if (fits_get_hdrspace(infptr, &ncards, &more, status)) {
         ffpmsg("pixel_filter: unable to determine number of keycards");
         goto CLEANUP;
      }

      for (i = 1; i <= ncards; ++i) {

         int keyclass;
         char card[FLEN_CARD];

         if (fits_read_record(infptr, i, card, status)) {
            snprintf(msg, 256,"pixel_filter: unable to read keycard %d", i);
            ffpmsg(msg);
            goto CLEANUP;
         }

         keyclass = fits_get_keyclass(card);
         if (keyclass == TYP_STRUC_KEY) {
            /* output structure defined by fits_create_img */
         }
         else if (keyclass == TYP_COMM_KEY && i < 12) {
            /* assume this is one of the FITS standard comments */
         }
         else if (keyclass == TYP_NULL_KEY && bitpix < 0) {
            /* do not transfer BLANK to real output image */
         }
         else if (keyclass == TYP_SCAL_KEY && bitpix < 0) {
            /* do not transfer BZERO, BSCALE to real output image */
         }
         else if (fits_write_record(outfptr, card, status)) {
            snprintf(msg,256, "pixel_filter: unable to write keycard '%s' [%d]\n",
                        card, *status);
            ffpmsg(msg);
            goto CLEANUP;
         }
      }
   }

   switch (bitpix) {
      case BYTE_IMG: datatype = TLONG; Info.datatype = TBYTE; break;
      case SHORT_IMG: datatype = TLONG; Info.datatype = TSHORT; break;
      case LONG_IMG: datatype = TLONG; Info.datatype = TLONG; break;
      case FLOAT_IMG: datatype = TDOUBLE; Info.datatype = TFLOAT; break;
      case DOUBLE_IMG: datatype = TDOUBLE; Info.datatype = TDOUBLE; break;

      default:
           snprintf(msg, 256,"pixel_filter: unexpected output bitpix %d\n", bitpix);
           ffpmsg(msg);
           *status = pERROR;
           goto CLEANUP;
   }

   if (bitpix > 0) { /* arrange for NULLs in output */
      long nullVal = filter->blank;
      if (!filter->blank) {
         int tstatus = 0;
         if (fits_read_key_lng(infptr, "BLANK", &nullVal, 0, &tstatus)) {

            writeBlankKwd = 1;

            if (bitpix == BYTE_IMG)
                nullVal = UCHAR_MAX;
            else if (bitpix == SHORT_IMG)
                nullVal = SHRT_MIN;
            else if (bitpix == LONG_IMG) {
               if (sizeof(long) == 8 && sizeof(int) == 4)
                  nullVal = INT_MIN;
               else
                  nullVal = LONG_MIN;
            }
            else
                printf("unhandled positive output BITPIX %d\n", bitpix);
         }

         filter->blank = nullVal;
      }

      fits_set_imgnull(outfptr, filter->blank, status);
      if (DEBUG_PIXFILTER)
         printf("using blank %ld\n", nullVal);

   }

   if (!filter->keyword[0]) {
      iteratorCol * colIter;
      DataInfo * varInfo;

      /*************************************/
      /* Create new iterator Output Column */
      /*************************************/
      col_cnt = lParse.nCols;
      if (fits_parser_allocateCol(&lParse, col_cnt, status))
         goto CLEANUP;
      lParse.nCols++;

      colIter = &lParse.colData[col_cnt];
      colIter->fptr = filter->ofptr;
      colIter->iotype = OutputCol;
      varInfo = &lParse.varData[col_cnt];
      set_image_col_types(&lParse, colIter->fptr, "CREATED", bitpix, varInfo, colIter);

      Info.maxRows = -1;
      Info.parseData = &lParse;

      if (ffiter(lParse.nCols, lParse.colData, 0,
                     0, fits_parser_workfn, &Info, status) == -1)
            *status = 0;
      else if (*status)
         goto CLEANUP;

      if (Info.anyNull) {
         if (writeBlankKwd) {
            fits_update_key_lng(outfptr, "BLANK", filter->blank, "NULL pixel value", status);
            if (*status)
                ffpmsg("pixel_filter: unable to write BLANK keyword");
            if (DEBUG_PIXFILTER) {
                printf("output has NULLs\n");
                printf("wrote blank [%d]\n", *status);
            }
         }
      }
      else if (bitpix > 0) /* never used a null */
         if (fits_set_imgnull(outfptr, -1234554321, status))
            ffpmsg("pixel_filter: unable to reset imgnull");
   }
   else {

      /* Put constant result into keyword */
      char * parName = filter->keyword;
      char * parInfo = filter->comment;

      result  = lParse.Nodes + lParse.resultNode;
      switch (Info.datatype) {
      case TDOUBLE:
         ffukyd(outfptr, parName, result->value.data.dbl, 15, parInfo, status);
         break;
      case TLONG:
         ffukyj(outfptr, parName, result->value.data.lng, parInfo, status);
         break;
      case TLOGICAL:
         ffukyl(outfptr, parName, result->value.data.log, parInfo, status);
         break;
      case TBIT:
      case TSTRING:
         ffukys(outfptr, parName, result->value.data.str, parInfo, status);
         break;
      default:
         snprintf(msg, 256,"pixel_filter: unexpected constant result type [%d]\n",
                Info.datatype);
         ffpmsg(msg);
      }
   }

CLEANUP:
   ffcprs(&lParse);
   return (*status);
}